

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JwtStrategy.cpp
# Opt level: O2

optional<Vault::AuthenticationResponse> * __thiscall
Vault::JwtStrategy::authenticate
          (optional<Vault::AuthenticationResponse> *__return_storage_ptr__,JwtStrategy *this,
          Client *client)

{
  allocator<char> local_a1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  size_type local_98;
  char local_90 [8];
  undefined8 uStack_88;
  Path local_80;
  Url local_60;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"/login",&local_a1);
  local_80.value_._M_dataplus._M_p = (pointer)&local_80.value_.field_2;
  if (local_a0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90) {
    local_80.value_.field_2._8_8_ = uStack_88;
  }
  else {
    local_80.value_._M_dataplus._M_p = (pointer)local_a0;
  }
  local_80.value_._M_string_length = local_98;
  local_98 = 0;
  local_90[0] = '\0';
  local_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_90;
  getUrl(&local_60,this,client,&local_80);
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/src/auth/strategies/JwtStrategy.cpp:6:84)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/src/auth/strategies/JwtStrategy.cpp:6:84)>
             ::_M_manager;
  local_40._M_unused._M_object = this;
  HttpConsumer::authenticate(__return_storage_ptr__,client,&local_60,(NoArgJsonProducer *)&local_40)
  ;
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

std::optional<Vault::AuthenticationResponse>
Vault::JwtStrategy::authenticate(const Vault::Client &client) {
  return HttpConsumer::authenticate(client, getUrl(client, Vault::Path{"/login"}), [this]() {
    nlohmann::json j;
    j = nlohmann::json::object();
    j["role"] = role_.value();
    j["jwt"] = jwt_.value();
    return j.dump();
  });
}